

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_singleLeafSeek_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_singleLeafSeek_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  bool bVar1;
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_00;
  const_reference pvVar2;
  char *pcVar3;
  char *in_R9;
  key_type kVar4;
  key_view akey;
  key_view akey_00;
  key_view akey_01;
  key_view akey_02;
  undefined8 in_stack_ffffffffffffee10;
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffee18;
  string local_11c0;
  AssertHelper local_11a0;
  Message local_1198;
  bool local_1189;
  undefined1 local_1188 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_1158;
  Message local_1150 [2];
  value_view local_1140;
  bool local_1129;
  undefined1 local_1128 [8];
  AssertionResult gtest_ar__17;
  Message local_1110;
  int local_1104;
  key_view local_1100;
  uint64_t local_10f0;
  undefined1 local_10e8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_10b8;
  Message local_10b0;
  bool local_10a1;
  undefined1 local_10a0 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_1070;
  Message local_1068;
  bool local_1059;
  undefined1 local_1058 [8];
  AssertionResult gtest_ar__15;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_1038;
  undefined1 local_1028 [8];
  iterator it_5;
  undefined1 local_eb0 [7];
  bool match_5;
  AssertHelper local_e90;
  Message local_e88;
  bool local_e79;
  undefined1 local_e78 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_e48;
  Message local_e40;
  bool local_e31;
  undefined1 local_e30 [8];
  AssertionResult gtest_ar__13;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_e10;
  undefined1 local_e00 [8];
  iterator it_4;
  undefined1 local_c88 [7];
  bool match_4;
  AssertHelper local_c68;
  Message local_c60;
  bool local_c51;
  undefined1 local_c50 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_c20;
  Message local_c18;
  bool local_c09;
  undefined1 local_c08 [8];
  AssertionResult gtest_ar__11;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_be8;
  undefined1 local_bd8 [8];
  iterator it_3;
  undefined1 local_a60 [7];
  bool match_3;
  AssertHelper local_a40;
  Message local_a38;
  bool local_a29;
  undefined1 local_a28 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_9f8;
  Message local_9f0 [2];
  value_view local_9e0;
  bool local_9c9;
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar__9;
  Message local_9b0;
  int local_9a4;
  key_view local_9a0;
  uint64_t local_990;
  undefined1 local_988 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_958;
  Message local_950;
  bool local_941;
  undefined1 local_940 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_910;
  Message local_908;
  bool local_8f9;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar__7;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_8d8;
  undefined1 local_8c8 [8];
  iterator it_2;
  undefined1 local_750 [7];
  bool match_2;
  AssertHelper local_730;
  Message local_728;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_6e8;
  Message local_6e0 [2];
  value_view local_6d0;
  bool local_6b9;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar__5;
  Message local_6a0;
  int local_694;
  key_view local_690;
  uint64_t local_680;
  undefined1 local_678 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_648;
  Message local_640;
  undefined1 local_638 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_608;
  Message local_600;
  bool local_5f1;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar__3;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_5d0;
  iterator *local_5c0;
  iterator *it_1;
  undefined1 local_5b0 [7];
  bool match_1;
  iterator e_1;
  AssertHelper local_420;
  Message local_418;
  bool local_409;
  undefined1 local_408 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_3d8;
  Message local_3d0 [2];
  value_view local_3c0;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__1;
  Message local_390;
  int local_384;
  key_view local_380;
  uint64_t local_370;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_1;
  Message local_350;
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar;
  AssertHelper local_310;
  Message local_308;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_;
  anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
  local_2d8;
  iterator *local_2c8;
  iterator *it;
  undefined1 local_2b8 [7];
  bool match;
  iterator e;
  TypeParam *db;
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  ARTIteratorTest_singleLeafSeek_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(in_stack_ffffffffffffee18,SUB81((ulong)in_stack_ffffffffffffee10 >> 0x38,0));
  this_00 = unodb::test::
            tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            ::get_db((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)&db);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)&db,1,v,false);
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator((iterator *)local_2b8,this_00);
  it._7_1_ = 0;
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_2d8.key,
             kVar4);
  local_2c8 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::seek((iterator *)local_2b8,(art_key_type)local_2d8,(bool *)((long)&it + 7)
                               ,true);
  local_2f9 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(local_2c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f8,&local_2f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2f8,(AssertionResult *)"it.valid()",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x140,pcVar3);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  local_341 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_340,"(match)","(true)",(bool *)((long)&it + 7),&local_341);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x141,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  local_380 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key(local_2c8);
  akey._M_extent = local_380._M_extent._M_extent_value;
  akey._M_ptr = (pointer)akey._M_extent._M_extent_value;
  local_370 = decode((anon_unknown_dwarf_d5c8 *)local_380._M_ptr,akey);
  local_384 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_368,"(decode(it.get_key()))","(1)",&local_370,&local_384);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x142,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  local_3c0 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_val(local_2c8);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_3a9 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_3c0,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(local_3d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_3a8,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x144,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d8,local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next(local_2c8);
  local_409 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(local_2c8);
  local_409 = !local_409;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_408,&local_409,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e_1.keybuf_.off,(internal *)local_408,(AssertionResult *)"it.valid()",
               "true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &e_1.keybuf_.off);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x146,pcVar3);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    std::__cxx11::string::~string((string *)&e_1.keybuf_.off);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_2b8);
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator((iterator *)local_5b0,this_00);
  it_1._7_1_ = 0;
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,1);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_5d0.key,
             kVar4);
  local_5c0 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::seek((iterator *)local_5b0,(art_key_type)local_5d0,
                               (bool *)((long)&it_1 + 7),false);
  local_5f1 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(local_5c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f0,&local_5f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar1) {
    testing::Message::Message(&local_600);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_5f0,(AssertionResult *)"it.valid()"
               ,"false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_608,&local_600);
    testing::internal::AssertHelper::~AssertHelper(&local_608);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_638,(bool *)((long)&it_1 + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_638,(AssertionResult *)0x30452b,
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_648,&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  local_690 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key(local_5c0);
  akey_00._M_extent = local_690._M_extent._M_extent_value;
  akey_00._M_ptr = (pointer)akey_00._M_extent._M_extent_value;
  local_680 = decode((anon_unknown_dwarf_d5c8 *)local_690._M_ptr,akey_00);
  local_694 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_678,"(decode(it.get_key()))","(1)",&local_680,&local_694);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(&local_6a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_6a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  local_6d0 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_val(local_5c0);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_6b9 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_6d0,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b8,&local_6b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(local_6e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_6b8,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__6.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_6e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x151,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6e8,local_6e0);
    testing::internal::AssertHelper::~AssertHelper(&local_6e8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next(local_5c0);
  local_719 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(local_5c0);
  local_719 = !local_719;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_718,&local_719,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_728);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_750,(internal *)local_718,(AssertionResult *)"it.valid()","true",
               "false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_750);
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x153,pcVar3);
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    std::__cxx11::string::~string((string *)local_750);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_5b0);
  it_2.keybuf_.off._7_1_ = 1;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator((iterator *)local_8c8,this_00);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_8d8.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_8c8,(art_key_type)local_8d8,
                   (bool *)((long)&it_2.keybuf_.off + 7),true);
  local_8f9 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)local_8c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8f8,&local_8f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f8);
  if (!bVar1) {
    testing::Message::Message(&local_908);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_8f8,(AssertionResult *)"it.valid()"
               ,"false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__8.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_910,&local_908);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
  local_941 = (bool)(~it_2.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_940,&local_941,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_940);
  if (!bVar1) {
    testing::Message::Message(&local_950);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_940,(AssertionResult *)0x30452b,
               "true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_958,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_958,&local_950);
    testing::internal::AssertHelper::~AssertHelper(&local_958);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_940);
  local_9a0 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key((iterator *)local_8c8);
  akey_01._M_extent = local_9a0._M_extent._M_extent_value;
  akey_01._M_ptr = (pointer)akey_01._M_extent._M_extent_value;
  local_990 = decode((anon_unknown_dwarf_d5c8 *)local_9a0._M_ptr,akey_01);
  local_9a4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_988,"(decode(it.get_key()))","(1)",&local_990,&local_9a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
  if (!bVar1) {
    testing::Message::Message(&local_9b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__9.message_,&local_9b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_9b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
  local_9e0 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_val((iterator *)local_8c8);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_9c9 = std::ranges::__equal_fn::
              operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&local_9e0,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9c8,&local_9c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c8);
  if (!bVar1) {
    testing::Message::Message(local_9f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_9c8,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__10.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_9f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x160,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9f8,local_9f0);
    testing::internal::AssertHelper::~AssertHelper(&local_9f8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_9f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next((iterator *)local_8c8);
  local_a29 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)local_8c8);
  local_a29 = !local_a29;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a28,&local_a29,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a28);
  if (!bVar1) {
    testing::Message::Message(&local_a38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a60,(internal *)local_a28,(AssertionResult *)"it.valid()","true",
               "false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_a60);
    testing::internal::AssertHelper::AssertHelper
              (&local_a40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x162,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a40,&local_a38);
    testing::internal::AssertHelper::~AssertHelper(&local_a40);
    std::__cxx11::string::~string((string *)local_a60);
    testing::Message::~Message(&local_a38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a28);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_8c8);
  it_3.keybuf_.off._7_1_ = 1;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator((iterator *)local_bd8,this_00);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,2);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_be8.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_bd8,(art_key_type)local_be8,
                   (bool *)((long)&it_3.keybuf_.off + 7),true);
  local_c09 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)local_bd8);
  local_c09 = !local_c09;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c08,&local_c09,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c08);
  if (!bVar1) {
    testing::Message::Message(&local_c18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_c08,
               (AssertionResult *)"it.valid()","true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__12.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_c20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x16a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c20,&local_c18);
    testing::internal::AssertHelper::~AssertHelper(&local_c20);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_c18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c08);
  local_c51 = (bool)(~it_3.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c50,&local_c51,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c50);
  if (!bVar1) {
    testing::Message::Message(&local_c60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c88,(internal *)local_c50,(AssertionResult *)0x30452b,"true","false",
               in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_c88);
    testing::internal::AssertHelper::AssertHelper
              (&local_c68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x16b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c68,&local_c60);
    testing::internal::AssertHelper::~AssertHelper(&local_c68);
    std::__cxx11::string::~string((string *)local_c88);
    testing::Message::~Message(&local_c60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c50);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_bd8);
  it_4.keybuf_.off._7_1_ = 1;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator((iterator *)local_e00,this_00);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0);
  gtest_ar__13.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_e10.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_e00,(art_key_type)local_e10,
                   (bool *)((long)&it_4.keybuf_.off + 7),false);
  local_e31 = unodb::
              db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid((iterator *)local_e00);
  local_e31 = !local_e31;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e30,&local_e31,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e30);
  if (!bVar1) {
    testing::Message::Message(&local_e40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_e30,
               (AssertionResult *)"it.valid()","true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__14.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_e48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x173,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e48,&local_e40);
    testing::internal::AssertHelper::~AssertHelper(&local_e48);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_e40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e30);
  local_e79 = (bool)(~it_4.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e78,&local_e79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e78);
  if (!bVar1) {
    testing::Message::Message(&local_e88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_eb0,(internal *)local_e78,(AssertionResult *)0x30452b,"true","false",
               in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_eb0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x174,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e90,&local_e88);
    testing::internal::AssertHelper::~AssertHelper(&local_e90);
    std::__cxx11::string::~string((string *)local_eb0);
    testing::Message::~Message(&local_e88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e78);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_e00);
  it_5.keybuf_.off._7_1_ = 1;
  unodb::
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator((iterator *)local_1028,this_00);
  kVar4 = unodb::test::
          tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,2);
  gtest_ar__15.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kVar4._M_ptr;
  unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&local_1038.key,
             kVar4);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek((iterator *)local_1028,(art_key_type)local_1038,
                   (bool *)((long)&it_5.keybuf_.off + 7),false);
  local_1059 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::valid((iterator *)local_1028);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1058,&local_1059,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1058);
  if (!bVar1) {
    testing::Message::Message(&local_1068);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_1058,
               (AssertionResult *)"it.valid()","false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__16.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1070,&local_1068);
    testing::internal::AssertHelper::~AssertHelper(&local_1070);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_1068);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1058);
  local_10a1 = (bool)(~it_5.keybuf_.off._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10a0,&local_10a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10a0);
  if (!bVar1) {
    testing::Message::Message(&local_10b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_10a0,(AssertionResult *)0x30452b,
               "true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_10b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_10b8,&local_10b0);
    testing::internal::AssertHelper::~AssertHelper(&local_10b8);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_10b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10a0);
  local_1100 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::get_key((iterator *)local_1028);
  akey_02._M_extent = local_1100._M_extent._M_extent_value;
  akey_02._M_ptr = (pointer)akey_02._M_extent._M_extent_value;
  local_10f0 = decode((anon_unknown_dwarf_d5c8 *)local_1100._M_ptr,akey_02);
  local_1104 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_10e8,"(decode(it.get_key()))","(1)",&local_10f0,&local_1104);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10e8);
  if (!bVar1) {
    testing::Message::Message(&local_1110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_10e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__17.message_,&local_1110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_1110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10e8);
  local_1140 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::get_val((iterator *)local_1028);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_1129 = std::ranges::__equal_fn::
               operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,&local_1140,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1128,&local_1129,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1128);
  if (!bVar1) {
    testing::Message::Message(local_1150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_1128,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__18.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x180,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1158,local_1150);
    testing::internal::AssertHelper::~AssertHelper(&local_1158);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(local_1150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1128);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next((iterator *)local_1028);
  local_1189 = unodb::
               db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
               ::iterator::valid((iterator *)local_1028);
  local_1189 = !local_1189;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1188,&local_1189,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1188);
  if (!bVar1) {
    testing::Message::Message(&local_1198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_11c0,(internal *)local_1188,(AssertionResult *)"it.valid()","true","false",
               in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_11c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_11a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x182,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11a0,&local_1198);
    testing::internal::AssertHelper::~AssertHelper(&local_11a0);
    std::__cxx11::string::~string((string *)&local_11c0);
    testing::Message::~Message(&local_1198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1188);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)local_1028);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)&db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, singleLeafSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(1, unodb::test::test_values[1]);
  {  // exact match, forward traversal (GTE)
    auto e = db.test_only_iterator();
    bool match = false;
    auto& it = e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(1)},
                      match, true /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_EQ(match, true);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
  {  // exact match, reverse traversal (LTE)
    auto e = db.test_only_iterator();
    bool match = false;
    auto& it = e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(1)},
                      match, false /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_TRUE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());  // nothing more in the iterator.
  }
  {  // forward traversal, before the first key in the data.
    // match=false and iterator is positioned on the first key in the
    // data.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
            true /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_FALSE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
  {  // forward traversal, after the last key in the data.  match=false
    // and iterator is invalidated.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(2)}, match,
            true /*fwd*/);
    UNODB_EXPECT_FALSE(it.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {  // reverse traversal, before the first key in the data.
    // match=false and iterator is invalidated.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
            false /*fwd*/);
    UNODB_EXPECT_FALSE(it.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {  // reverse traversal, after the last key in the data.  match=false
    // and iterator is positioned at the last key.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(2)}, match,
            false /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_FALSE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
}